

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckTypedefs.cxx
# Opt level: O1

string * __thiscall
kws::Parser::FindTypedef_abi_cxx11_
          (string *__return_storage_ptr__,Parser *this,size_t start,size_t end,size_t *pos,
          size_t *beg,size_t *typdefpos)

{
  pointer pcVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  string *psVar6;
  ulong uVar7;
  string store;
  string sub;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  psVar6 = &this->m_BufferNoComment;
  uVar3 = std::__cxx11::string::find((char *)psVar6,0x17840b,start);
  if (uVar3 == 0xffffffffffffffff) {
    *pos = 0xffffffffffffffff;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    *typdefpos = uVar3;
    uVar3 = std::__cxx11::string::find((char *)psVar6,0x177d56,uVar3);
    std::__cxx11::string::substr((ulong)local_50,(ulong)psVar6);
    lVar4 = std::__cxx11::string::find((char *)local_50,0x177d62,0);
    if ((((lVar4 == -1) &&
         (lVar4 = std::__cxx11::string::find((char *)local_50,0x16a9d1,0), lVar4 == -1)) &&
        (lVar4 = std::__cxx11::string::find((char *)local_50,0x16acee,0), lVar4 == -1)) &&
       (lVar4 = std::__cxx11::string::find((char *)local_50,0x16f702,0), lVar4 == -1)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      if (uVar3 < end) {
        bVar2 = true;
        bVar5 = false;
        uVar7 = uVar3;
        do {
          uVar7 = uVar7 - 1;
          if ((psVar6->_M_dataplus)._M_p[uVar7] == ' ') {
            if (bVar5) {
              bVar2 = false;
            }
          }
          else {
            pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
            local_70[0] = local_60;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_70,pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
            std::__cxx11::string::_M_replace_aux
                      ((ulong)__return_storage_ptr__,0,__return_storage_ptr__->_M_string_length,
                       '\x01');
            std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70[0]);
            *beg = uVar7;
            if (local_70[0] != local_60) {
              operator_delete(local_70[0]);
            }
            bVar2 = true;
            bVar5 = true;
          }
        } while (bVar2);
      }
      *pos = uVar3;
    }
    else {
      *pos = uVar3;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::FindTypedef(size_t start, size_t end,size_t & pos,size_t & beg,size_t & typdefpos)
{
  size_t posTypedef  = m_BufferNoComment.find("typedef",start);
  if(posTypedef == std::string::npos)
    {
    pos = std::string::npos;
    return "";
    }

  typdefpos = posTypedef;
  size_t posSemicolon = m_BufferNoComment.find(";",posTypedef);

  // Check if we have any () in the subword then we don't check the typdef
  std::string sub = m_BufferNoComment.substr(posTypedef,posSemicolon-posTypedef);
  if((sub.find("(",0) != std::string::npos)
    || (sub.find(")",0) != std::string::npos)
    || (sub.find("{",0) != std::string::npos)
    || (sub.find("}",0) != std::string::npos)
    )
    {
    pos = posSemicolon;
    return "";
    }

  std::string typedefname = "";
  if(posSemicolon != std::string::npos && posSemicolon<end)
    {
    // We try to find the word before that
    size_t i=posSemicolon-1;
    bool inWord = true;
    bool first = false;
    while(inWord)
      {
      if(m_BufferNoComment[i] != ' ')
        {
        std::string store = typedefname;
        typedefname = m_BufferNoComment[i];
        typedefname += store;
        beg = i;
        inWord = true;
        first = true;
        }
      else // we have a space
        {
        if(first)
          {
          inWord = false;
          }
        }
      i--;
      }
    }

  pos = posSemicolon;
  return typedefname;
}